

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

size_t __thiscall clickhouse::ArrayInput::DoNext(ArrayInput *this,void **ptr,size_t len)

{
  ulong uVar1;
  
  uVar1 = this->len_;
  if (uVar1 < len) {
    len = uVar1;
  }
  *ptr = this->data_;
  this->len_ = uVar1 - len;
  this->data_ = this->data_ + len;
  return len;
}

Assistant:

size_t ArrayInput::DoNext(const void** ptr, size_t len) {
    len = std::min(len_, len);

    *ptr   = data_;
    len_  -= len;
    data_ += len;

    return len;
}